

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O3

void borg_free_flow(void)

{
  borg_free_flow_misc();
  borg_free_flow_glyph();
  borg_free_flow_stairs();
  track_closed.num = 0;
  track_closed.size = 0;
  mem_free(track_closed.x);
  track_closed.x = (int *)0x0;
  mem_free(track_closed.y);
  track_closed.y = (int *)0x0;
  track_door.num = 0;
  track_door.size = 0;
  mem_free(track_door.x);
  track_door.x = (int *)0x0;
  mem_free(track_door.y);
  track_door.y = (int *)0x0;
  track_step.num = 0;
  track_step.size = 0;
  mem_free(track_step.x);
  track_step.x = (int *)0x0;
  mem_free(track_step.y);
  track_step.y = (int *)0x0;
  mem_free(borg_data_icky);
  borg_data_icky = (borg_data *)0x0;
  mem_free(borg_data_know);
  borg_data_know = (borg_data *)0x0;
  mem_free(borg_data_hard);
  borg_data_hard = (borg_data *)0x0;
  mem_free(borg_data_cost);
  borg_data_cost = (borg_data *)0x0;
  mem_free(borg_data_flow);
  borg_data_flow = (borg_data *)0x0;
  return;
}

Assistant:

void borg_free_flow(void)
{
    borg_free_flow_misc();
    borg_free_flow_glyph();
    borg_free_flow_stairs();

    borg_free_track(&track_closed);
    borg_free_track(&track_door);
    borg_free_track(&track_step);

    mem_free(borg_data_icky);
    borg_data_icky = NULL;
    mem_free(borg_data_know);
    borg_data_know = NULL;
    mem_free(borg_data_hard);
    borg_data_hard = NULL;
    mem_free(borg_data_cost);
    borg_data_cost = NULL;
    mem_free(borg_data_flow);
    borg_data_flow = NULL;
}